

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O2

int snprintf_can_error_frame(char *buf,size_t len,canfd_frame *cf,char *sep)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  int *piVar8;
  int iVar9;
  char *pcVar10;
  uint uVar11;
  long lVar12;
  ulong __maxlen;
  size_t sVar13;
  
  uVar1 = cf->can_id;
  iVar9 = 0;
  if ((uVar1 >> 0x1d & 1) != 0) {
    if ((uVar1 & 0x1fffffff) < 0x401) {
      pcVar5 = ",";
      if (sep != (char *)0x0) {
        pcVar5 = sep;
      }
      piVar8 = &error_classes_rel;
      iVar9 = 0;
      iVar7 = 0;
      for (lVar12 = 0; lVar6 = (long)iVar9, lVar12 != 10; lVar12 = lVar12 + 1) {
        uVar11 = (uint)lVar12;
        if ((uVar1 >> (uVar11 & 0x1f) & 1) == 0) goto LAB_00104a2c;
        if (iVar7 != 0) {
          uVar2 = snprintf(buf + lVar6,len - lVar6,"%s",pcVar5);
          if (((int)uVar2 < 0) || (len - lVar6 <= (ulong)uVar2)) goto LAB_00104a8f;
          iVar9 = iVar9 + uVar2;
        }
        __maxlen = len - (long)iVar9;
        uVar2 = snprintf(buf + iVar9,__maxlen,"%s",(long)&error_classes_rel + (long)*piVar8);
        if (((int)uVar2 < 0) || (__maxlen <= uVar2)) {
LAB_00104a8f:
          *buf = '\0';
          return 0;
        }
        iVar9 = uVar2 + iVar9;
        if (8 < uVar11 - 1) goto switchD_00104886_caseD_4;
        lVar6 = (long)iVar9;
        switch(uVar11) {
        case 1:
          iVar4 = 0;
          if (len - lVar6 != 0) {
            iVar4 = snprintf(buf + lVar6,len - lVar6,"{at bit %d}",(ulong)cf->data[0]);
          }
          iVar9 = iVar9 + iVar4;
          break;
        case 2:
          iVar4 = 0;
          sVar13 = len - lVar6;
          if (sVar13 != 0) {
            pcVar10 = buf + lVar6;
            iVar4 = snprintf(pcVar10,sVar13,"{");
            iVar3 = snprintf_error_data(pcVar10 + iVar4,sVar13 - (long)iVar4,cf->data[1],
                                        controller_problems,7);
            iVar4 = iVar4 + iVar3;
            iVar3 = snprintf(pcVar10 + iVar4,sVar13 - (long)iVar4,"}");
            iVar4 = iVar4 + iVar3;
          }
          goto LAB_001049fd;
        case 3:
          iVar4 = 0;
          sVar13 = len - lVar6;
          if (sVar13 != 0) {
            pcVar10 = buf + lVar6;
            iVar4 = snprintf(pcVar10,sVar13,"{{");
            iVar3 = snprintf_error_data(pcVar10 + iVar4,sVar13 - (long)iVar4,cf->data[2],
                                        protocol_violation_types,8);
            iVar4 = iVar4 + iVar3;
            iVar3 = snprintf(pcVar10 + iVar4,sVar13 - (long)iVar4,"}{");
            iVar4 = iVar4 + iVar3;
            if ((byte)(cf->data[3] - 1) < 0x1f) {
              iVar3 = snprintf(pcVar10 + iVar4,sVar13 - (long)iVar4,"%s",
                               protocol_violation_locations_rel +
                               *(int *)(protocol_violation_locations_rel + (ulong)cf->data[3] * 4));
              iVar4 = iVar4 + iVar3;
            }
            iVar3 = snprintf(pcVar10 + iVar4,sVar13 - (long)iVar4,"}}");
            iVar4 = iVar4 + iVar3;
          }
LAB_001049fd:
          iVar9 = iVar4 + iVar9;
          break;
        case 9:
          iVar4 = snprintf_error_cnt(buf + lVar6,len - lVar6,cf);
          iVar9 = iVar9 + iVar4;
        }
switchD_00104886_caseD_4:
        iVar7 = iVar7 + 1;
LAB_00104a2c:
        piVar8 = piVar8 + 1;
      }
      if (((cf->can_id & 0x200) == 0) && ((cf->data[6] != '\0' || (cf->data[7] != '\0')))) {
        iVar7 = snprintf(buf + lVar6,len - lVar6,"%serror-counter-tx-rx",pcVar5);
        iVar7 = iVar7 + iVar9;
        iVar9 = snprintf_error_cnt(buf + iVar7,len - (long)iVar7,cf);
        iVar9 = iVar7 + iVar9;
      }
    }
    else {
      iVar9 = 0;
      fprintf(_stderr,"Error class %#x is invalid\n");
    }
  }
  return iVar9;
}

Assistant:

int snprintf_can_error_frame(char *buf, size_t len, const struct canfd_frame *cf,
                  const char* sep)
{
	canid_t class, mask;
	int i, n = 0, classes = 0;
	char *defsep = ",";

	if (!(cf->can_id & CAN_ERR_FLAG))
		return 0;

	class = cf->can_id & CAN_EFF_MASK;
	if (class > (1 << ARRAY_SIZE(error_classes))) {
		fprintf(stderr, "Error class %#x is invalid\n", class);
		return 0;
	}

	if (!sep)
		sep = defsep;

	for (i = 0; i < (int)ARRAY_SIZE(error_classes); i++) {
		mask = 1 << i;
		if (class & mask) {
			int tmp_n = 0;
			if (classes) {
				/* Fix for potential buffer overflow https://lgtm.com/rules/1505913226124/ */
				tmp_n = snprintf(buf + n, len - n, "%s", sep);
				if (tmp_n < 0 || (size_t)tmp_n >= len - n) {
					buf[0] = 0; /* empty terminated string */
					return 0;
				}
				n += tmp_n;
			}
			tmp_n = snprintf(buf + n, len - n, "%s", error_classes[i]);
			if (tmp_n < 0 || (size_t)tmp_n >= len - n) {
				buf[0] = 0; /* empty terminated string */
				return 0;
			}
			n += tmp_n;
			if (mask == CAN_ERR_LOSTARB)
				n += snprintf_error_lostarb(buf + n, len - n,
							   cf);
			if (mask == CAN_ERR_CRTL)
				n += snprintf_error_ctrl(buf + n, len - n, cf);
			if (mask == CAN_ERR_PROT)
				n += snprintf_error_prot(buf + n, len - n, cf);
			if (mask == CAN_ERR_CNT)
				n += snprintf_error_cnt(buf + n, len - n, cf);
			classes++;
		}
	}

	if (!(cf->can_id & CAN_ERR_CNT) && (cf->data[6] || cf->data[7])) {
		n += snprintf(buf + n, len - n, "%serror-counter-tx-rx", sep);
		n += snprintf_error_cnt(buf + n, len - n, cf);
	}

	return n;
}